

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SyncPointVk::SyncPointVk
          (SyncPointVk *this,SoftwareQueueIndex CommandQueueId,Uint32 NumContexts,
          VulkanSyncObjectManager *SyncObjectMngr,VkDevice LogicalDevice,Uint64 dbgValue)

{
  VulkanRecycledSemaphore *pSemaphores;
  SyncPointVk *pSVar1;
  ulong uVar2;
  NativeType *ppVVar3;
  allocator local_1a1;
  String Name;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
  super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
  super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_CommandQueueId).m_Value = CommandQueueId.m_Value;
  this->m_NumSemaphores = (Uint8)NumContexts;
  VulkanUtilities::VulkanSyncObjectManager::CreateFence(&this->m_Fence,SyncObjectMngr);
  pSemaphores = this->m_Semaphores;
  *(undefined8 *)
   ((long)&this->m_Semaphores[0].m_pManager.
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  *(undefined8 *)((long)&this->m_Semaphores[0].m_VkSyncObject + 1) = 0;
  this->m_Semaphores[0].m_pManager.
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->m_Semaphores[0].m_pManager.
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this->m_CommandQueueId).m_Value != CommandQueueId.m_Value) {
    FormatString<char[45]>(&Name,(char (*) [45])"Not enough bits to store command queue index");
    DebugAssertionFailed
              (Name._M_dataplus._M_p,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5a);
    std::__cxx11::string::~string((string *)&Name);
  }
  if (this->m_NumSemaphores != NumContexts) {
    FormatString<char[45]>(&Name,(char (*) [45])"Not enough bits to store command queue count");
    DebugAssertionFailed
              (Name._M_dataplus._M_p,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5b);
    std::__cxx11::string::~string((string *)&Name);
  }
  pSVar1 = this + 1;
  for (uVar2 = 1; uVar2 < NumContexts; uVar2 = uVar2 + 1) {
    *(undefined8 *)
     ((long)&(pSVar1->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
             super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     1) = 0;
    *(undefined8 *)&pSVar1->m_NumSemaphores = 0;
    (pSVar1->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
    super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (pSVar1->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
    super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar1 = (SyncPointVk *)
             &(pSVar1->m_Fence).m_pManager.
              super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  }
  if (1 < NumContexts) {
    VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
              (SyncObjectMngr,pSemaphores,NumContexts - 1);
    std::
    swap<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
              (pSemaphores + CommandQueueId.m_Value,pSemaphores + (NumContexts - 1));
  }
  std::__cxx11::string::string((string *)&local_110,"Queue (",(allocator *)&local_d0);
  std::__cxx11::to_string(&local_170,(uint)CommandQueueId.m_Value);
  std::operator+(&local_150,&local_110,&local_170);
  std::operator+(&local_f0,&local_150,") Value (");
  std::__cxx11::to_string(&local_130,dbgValue);
  std::operator+(&local_b0,&local_f0,&local_130);
  std::operator+(&Name,&local_b0,")");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  VulkanUtilities::SetFenceName(LogicalDevice,(this->m_Fence).m_VkSyncObject,Name._M_dataplus._M_p);
  ppVVar3 = &this->m_Semaphores[0].m_VkSyncObject;
  for (uVar2 = 0; uVar2 < this->m_NumSemaphores; uVar2 = uVar2 + 1) {
    if (*ppVVar3 != (NativeType)0x0) {
      std::__cxx11::string::string((string *)&local_d0,"Queue (",&local_1a1);
      std::__cxx11::to_string(&local_50,(uint)CommandQueueId.m_Value);
      std::operator+(&local_130,&local_d0,&local_50);
      std::operator+(&local_170,&local_130,") Value (");
      std::__cxx11::to_string(&local_70,dbgValue);
      std::operator+(&local_110,&local_170,&local_70);
      std::operator+(&local_150,&local_110,") Ctx (");
      std::__cxx11::to_string(&local_90,(uint)uVar2);
      std::operator+(&local_f0,&local_150,&local_90);
      std::operator+(&local_b0,&local_f0,")");
      std::__cxx11::string::operator=((string *)&Name,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      VulkanUtilities::SetSemaphoreName(LogicalDevice,*ppVVar3,Name._M_dataplus._M_p);
    }
    ppVVar3 = ppVVar3 + 4;
  }
  std::__cxx11::string::~string((string *)&Name);
  return;
}

Assistant:

SyncPointVk::SyncPointVk(SoftwareQueueIndex                        CommandQueueId,
                         Uint32                                    NumContexts,
                         VulkanUtilities::VulkanSyncObjectManager& SyncObjectMngr,
                         VkDevice                                  LogicalDevice,
                         Uint64                                    dbgValue) :
    m_CommandQueueId{CommandQueueId},
    m_NumSemaphores{static_cast<Uint8>(NumContexts)},
    m_Fence{SyncObjectMngr.CreateFence()}
{
    VERIFY(m_CommandQueueId == CommandQueueId, "Not enough bits to store command queue index");
    VERIFY(m_NumSemaphores == NumContexts, "Not enough bits to store command queue count");

    // Call constructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < NumContexts; ++s)
        new (&m_Semaphores[s]) VulkanUtilities::VulkanRecycledSemaphore{};

    // Semaphores are used to synchronize between queues; they are not used for synchronization within one queue.
    if (NumContexts > 1)
    {
        SyncObjectMngr.CreateSemaphores(m_Semaphores, NumContexts - 1);

        // Semaphore for the current queue is not used.
        std::swap(m_Semaphores[CommandQueueId], m_Semaphores[NumContexts - 1]);
    }

#ifdef DILIGENT_DEBUG
    String Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ")";
    VulkanUtilities::SetFenceName(LogicalDevice, m_Fence, Name.c_str());

    for (Uint32 s = 0; s < m_NumSemaphores; ++s)
    {
        if (m_Semaphores[s])
        {
            Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ") Ctx (" + std::to_string(s) + ")";
            VulkanUtilities::SetSemaphoreName(LogicalDevice, m_Semaphores[s], Name.c_str());
        }
    }
#endif
}